

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_adjust_idle_stream(nghttp2_session *session)

{
  nghttp2_stream *stream;
  nghttp2_stream *pnVar1;
  int iVar2;
  uint32_t local_54;
  uint32_t local_50;
  uint local_4c;
  uint local_48;
  uint32_t local_44;
  uint local_40;
  uint local_3c;
  nghttp2_stream *next;
  nghttp2_stream *head;
  int rv;
  size_t max;
  nghttp2_session *session_local;
  
  if ((session->local_settings).max_concurrent_streams <
      session->pending_local_max_concurrent_stream) {
    local_3c = (session->local_settings).max_concurrent_streams;
  }
  else {
    local_3c = session->pending_local_max_concurrent_stream;
  }
  if (local_3c < 0x10) {
    local_40 = 0x10;
  }
  else {
    if ((session->local_settings).max_concurrent_streams <
        session->pending_local_max_concurrent_stream) {
      local_44 = (session->local_settings).max_concurrent_streams;
    }
    else {
      local_44 = session->pending_local_max_concurrent_stream;
    }
    local_40 = local_44;
  }
  if (local_40 < 0x65) {
    if ((session->local_settings).max_concurrent_streams <
        session->pending_local_max_concurrent_stream) {
      local_4c = (session->local_settings).max_concurrent_streams;
    }
    else {
      local_4c = session->pending_local_max_concurrent_stream;
    }
    if (local_4c < 0x10) {
      local_50 = 0x10;
    }
    else {
      if ((session->local_settings).max_concurrent_streams <
          session->pending_local_max_concurrent_stream) {
        local_54 = (session->local_settings).max_concurrent_streams;
      }
      else {
        local_54 = session->pending_local_max_concurrent_stream;
      }
      local_50 = local_54;
    }
    local_48 = local_50;
  }
  else {
    local_48 = 100;
  }
  while( true ) {
    if (session->num_idle_streams <= (ulong)local_48) {
      return 0;
    }
    stream = session->idle_stream_head;
    if (stream == (nghttp2_stream *)0x0) break;
    pnVar1 = stream->closed_next;
    iVar2 = nghttp2_session_destroy_stream(session,stream);
    if (iVar2 != 0) {
      return iVar2;
    }
    session->idle_stream_head = pnVar1;
    if (session->idle_stream_head == (nghttp2_stream *)0x0) {
      session->idle_stream_tail = (nghttp2_stream *)0x0;
    }
    else {
      session->idle_stream_head->closed_prev = (nghttp2_stream *)0x0;
    }
    session->num_idle_streams = session->num_idle_streams - 1;
  }
  __assert_fail("head",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                ,0x6a9,"int nghttp2_session_adjust_idle_stream(nghttp2_session *)");
}

Assistant:

int nghttp2_session_adjust_idle_stream(nghttp2_session *session) {
  size_t max;
  int rv;

  /* Make minimum number of idle streams 16, and maximum 100, which
     are arbitrary chosen numbers. */
  max = nghttp2_min(
      100, nghttp2_max(
               16, nghttp2_min(session->local_settings.max_concurrent_streams,
                               session->pending_local_max_concurrent_stream)));

  DEBUGF("stream: adjusting kept idle streams num_idle_streams=%zu, max=%zu\n",
         session->num_idle_streams, max);

  while (session->num_idle_streams > max) {
    nghttp2_stream *head;
    nghttp2_stream *next;

    head = session->idle_stream_head;
    assert(head);

    next = head->closed_next;

    rv = nghttp2_session_destroy_stream(session, head);
    if (rv != 0) {
      return rv;
    }

    /* head is now destroyed */

    session->idle_stream_head = next;

    if (session->idle_stream_head) {
      session->idle_stream_head->closed_prev = NULL;
    } else {
      session->idle_stream_tail = NULL;
    }

    --session->num_idle_streams;
  }

  return 0;
}